

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O2

TestReturnValue __thiscall
embree::NewDeleteGeometryTest::run(NewDeleteGeometryTest *this,VerifyApplication *state,bool silent)

{
  RandomSampler *pRVar1;
  RTCError code;
  TestReturnValue TVar2;
  size_t i;
  RTCDevice userPtr;
  long lVar3;
  ulong uVar4;
  int sse2;
  size_t i_1;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  float fVar8;
  Vec3fa VVar9;
  RTCDeviceRef device;
  float local_12e8;
  Vec3fa pos;
  VerifyScene scene;
  string cfg;
  uint geom [128];
  Sphere spheres [128];
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)spheres,
                 &(state->super_Application).rtcore,",isa=");
  stringOfISA_abi_cxx11_((string *)geom,(embree *)(ulong)(uint)(this->super_Test).sse2,sse2);
  std::operator+(&cfg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)spheres,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)geom);
  std::__cxx11::string::~string((string *)geom);
  std::__cxx11::string::~string((string *)spheres);
  userPtr = (RTCDevice)rtcNewDevice(cfg._M_dataplus._M_p);
  device.device = userPtr;
  code = rtcGetDeviceError();
  errorHandler(userPtr,code,(char *)0x0);
  VerifyScene::VerifyScene(&scene,&device,this->sflags);
  AssertNoError(device.device);
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
    geom[lVar3] = 0xffffffff;
  }
  lVar3 = 0;
  do {
    *(undefined4 *)((long)&spheres[0].r + lVar3) = 0;
    *(undefined8 *)((long)&spheres[0].pos.field_0 + lVar3) = 0;
    *(undefined8 *)((long)&spheres[0].pos.field_0 + lVar3 + 8) = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x1000);
  uVar6 = 0;
  memset(spheres,0,0x1000);
  pRVar1 = &(this->super_Test).sampler;
  do {
    fVar8 = state->intensity * 50.0;
    uVar4 = (ulong)fVar8;
    if (((long)(fVar8 - 9.223372e+18) & (long)uVar4 >> 0x3f | uVar4) <= uVar6) {
      for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
        if (geom[lVar3] != 0xffffffff) {
          rtcDetachGeometry(scene.scene.scene);
        }
      }
      rtcCommitScene(scene.scene.scene);
      AssertNoError(device.device);
      rtcCommitScene(scene.scene.scene);
      AssertNoError(device.device);
      VerifyScene::~VerifyScene(&scene);
      RTCDeviceRef::~RTCDeviceRef(&device);
      std::__cxx11::string::~string((string *)&cfg);
      return PASSED;
    }
    lVar3 = 10;
    while (bVar7 = lVar3 != 0, lVar3 = lVar3 + -1, bVar7) {
      uVar5 = (this->super_Test).sampler.s * 0x19660d + 0x3c6ef35f;
      (this->super_Test).sampler.s = uVar5;
      VVar9 = VerifyApplication::Test::random_Vec3fa(&this->super_Test);
      uVar5 = uVar5 >> 1 & 0x7f;
      if (geom[uVar5] == 0xffffffff) {
        uVar5 = pRVar1->s * 0x19660d + 0x3c6ef35f;
        pRVar1->s = uVar5;
        TVar2 = (*(code *)(&DAT_001ee278 + *(int *)(&DAT_001ee278 + ((ulong)(uVar5 >> 1) % 0xb) * 4)
                          ))(local_12e8 * 100.0,VVar9.field_0._8_8_);
        return TVar2;
      }
      rtcDetachGeometry(scene.scene.scene);
      AssertNoError(device.device);
      geom[uVar5] = 0xffffffff;
    }
    rtcCommitScene(scene.scene.scene);
    AssertNoError(device.device);
    rtcCommitScene(scene.scene.scene);
    AssertNoError(device.device);
    if ((uVar6 & 1) == 0) {
      std::operator<<((ostream *)&std::cout,".");
      std::ostream::flush();
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

VerifyApplication::TestReturnValue run(VerifyApplication* state, bool silent)
    {
      std::string cfg = state->rtcore + ",isa="+stringOfISA(isa);
      RTCDeviceRef device = rtcNewDevice(cfg.c_str());
      errorHandler(nullptr,rtcGetDeviceError(device));
      VerifyScene scene(device,sflags);
      AssertNoError(device);
      unsigned int geom[128];
      for (size_t i=0; i<128; i++) geom[i] = -1;
      Sphere spheres[128];
      memset(spheres,0,sizeof(spheres));
      
      for (size_t i=0; i<size_t(50*state->intensity); i++) 
      {
        for (size_t j=0; j<10; j++) {
          int index = random_int()%128;
          Vec3fa pos = 100.0f*random_Vec3fa();
          if (geom[index] == -1) {
            switch (random_int()%11) {
            case 0: geom[index] = scene.addSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,10).first; break;
            case 1: geom[index] = scene.addSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,10,-1,random_motion_vector(1.0f)).first; break;
            case 2: geom[index] = scene.addQuadSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,10).first; break;
            case 3: geom[index] = scene.addQuadSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,10,-1,random_motion_vector(1.0f)).first; break;
            case 4: geom[index] = scene.addGridSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,10).first; break;
            case 5: geom[index] = scene.addGridSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,10,-1,random_motion_vector(1.0f)).first; break;
            case 6: geom[index] = scene.addHair(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,1.0f,2.0f,10).first; break;
            case 7: geom[index] = scene.addHair(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,1.0f,2.0f,10,random_motion_vector(1.0f)).first; break;
            case 8: geom[index] = scene.addSubdivSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,4,4).first; break;
            case 9: geom[index] = scene.addSubdivSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,4,4,-1,random_motion_vector(1.0f)).first; break;
            case 10: 
              spheres[index] = Sphere(pos,2.0f);
              geom[index] = scene.addUserGeometryEmpty(sampler,RTC_BUILD_QUALITY_MEDIUM,&spheres[index]).first; break;
            }
            AssertNoError(device);
          }
          else { 
            rtcDetachGeometry(scene,geom[index]);     
            AssertNoError(device);
            geom[index] = -1; 
          }
        }
        rtcCommitScene(scene);
        AssertNoError(device);
        rtcCommitScene(scene);
        AssertNoError(device);
        if (i%2 == 0) std::cout << "." << std::flush;
      }
      
      /* now delete all geometries */
      for (size_t i=0; i<128; i++) 
        if (geom[i] != -1) rtcDetachGeometry(scene,geom[i]);
      rtcCommitScene(scene);
      AssertNoError(device);

      rtcCommitScene (scene);
      AssertNoError(device);

      return VerifyApplication::PASSED;
    }